

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_template.cpp
# Opt level: O3

unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_> __thiscall
pfederc::Parser::fromExprToTemplateDecl
          (Parser *this,unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *rhs)

{
  size_t sVar1;
  size_t sVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  _func_int **pp_Var6;
  Lexer *pLVar7;
  long *in_RDX;
  Parser *this_00;
  pointer __p;
  long *plVar8;
  Error<pfederc::SyntaxErrorCode> *local_38;
  undefined1 local_30 [16];
  
  plVar8 = (long *)*in_RDX;
  if (plVar8 != (long *)0x0) {
    iVar4 = (int)plVar8[3];
    if (iVar4 == 0) {
      lVar5 = __dynamic_cast(plVar8,&Expr::typeinfo,&TokenExpr::typeinfo,0);
      if (lVar5 == 0) goto LAB_00119667;
      bVar3 = Token::operator==(*(Token **)(lVar5 + 0x38),TOK_ID);
      plVar8 = (long *)*in_RDX;
      if (bVar3) {
        *in_RDX = 0;
        if (plVar8 == (long *)0x0) {
          pp_Var6 = (_func_int **)0x0;
        }
        else {
          pp_Var6 = (_func_int **)__dynamic_cast(plVar8,&Expr::typeinfo,&TokenExpr::typeinfo,0);
        }
        pLVar7 = (Lexer *)operator_new(0x10);
        pLVar7->_vptr_Lexer = pp_Var6;
        *(undefined8 *)&pLVar7->cfg = 0;
        goto LAB_00119619;
      }
      iVar4 = (int)plVar8[3];
    }
    if (iVar4 == 0x12) {
      if ((undefined **)*plVar8 != &PTR__BiOpExpr_0012b990) {
        __cxa_bad_cast();
      }
      if ((short)plVar8[8] != 0x53) goto LAB_0011956d;
      if (*(int *)(plVar8[9] + 0x18) == 0) {
        lVar5 = __dynamic_cast(plVar8[9],&Expr::typeinfo,&TokenExpr::typeinfo,0);
        if (lVar5 == 0) {
LAB_00119667:
          __cxa_bad_cast();
        }
        bVar3 = Token::operator==(*(Token **)(lVar5 + 0x38),TOK_ID);
        if (bVar3) {
          lVar5 = plVar8[9];
          plVar8[9] = 0;
          if (lVar5 == 0) {
            pp_Var6 = (_func_int **)0x0;
          }
          else {
            pp_Var6 = (_func_int **)__dynamic_cast(lVar5,&Expr::typeinfo,&TokenExpr::typeinfo,0);
          }
          lVar5 = plVar8[10];
          plVar8[10] = 0;
          pLVar7 = (Lexer *)operator_new(0x10);
          pLVar7->_vptr_Lexer = pp_Var6;
          *(long *)&pLVar7->cfg = lVar5;
          goto LAB_00119619;
        }
      }
      local_38 = (Error<pfederc::SyntaxErrorCode> *)operator_new(0x38);
      sVar1 = plVar8[6];
      local_38->logLevel = LVL_ERROR;
      local_38->err = STX_ERR_INVALID_VARDECL_ID;
      sVar2 = plVar8[5];
      (local_38->pos).line = plVar8[4];
      (local_38->pos).startIndex = sVar2;
      (local_38->pos).endIndex = sVar1;
      (local_38->extraPos).super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (local_38->extraPos).super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (local_38->extraPos).super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      this_00 = (Parser *)local_30;
    }
    else {
LAB_0011956d:
      local_38 = (Error<pfederc::SyntaxErrorCode> *)operator_new(0x38);
      sVar1 = plVar8[6];
      local_38->logLevel = LVL_ERROR;
      local_38->err = STX_ERR_EXPECTED_VARDECL;
      sVar2 = plVar8[5];
      (local_38->pos).line = plVar8[4];
      (local_38->pos).startIndex = sVar2;
      (local_38->pos).endIndex = sVar1;
      (local_38->extraPos).super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (local_38->extraPos).super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (local_38->extraPos).super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      this_00 = (Parser *)(local_30 + 8);
    }
    generateError(this_00,(unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                           *)rhs);
    std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)this_00);
    if (local_38 != (Error<pfederc::SyntaxErrorCode> *)0x0) {
      std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
                ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)&local_38,local_38);
    }
  }
  pLVar7 = (Lexer *)0x0;
LAB_00119619:
  this->lexer = pLVar7;
  return (__uniq_ptr_data<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>,_true,_true>
          )(__uniq_ptr_data<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<TemplateDecl> Parser::fromExprToTemplateDecl(std::unique_ptr<Expr> &&rhs) noexcept {
  if (!rhs) {
    return nullptr;
  }

  if (isTokenExpr(*rhs, TokenType::TOK_ID)) {
    return std::make_unique<TemplateDecl>(std::unique_ptr<TokenExpr>(
          dynamic_cast<TokenExpr*>(rhs.release())));
  }

  if (!isBiOpExpr(*rhs, TokenType::TOK_OP_DCL)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
      SyntaxErrorCode::STX_ERR_EXPECTED_VARDECL, rhs->getPosition()));
    return nullptr;
  }

  BiOpExpr& bioprhs = dynamic_cast<BiOpExpr&>(*rhs);

  if (!isTokenExpr(bioprhs.getLeft(), TokenType::TOK_ID)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR, SyntaxErrorCode::STX_ERR_INVALID_VARDECL_ID, bioprhs.getPosition()));
    return nullptr;
  }
  
  return std::make_unique<TemplateDecl>(
    std::unique_ptr<TokenExpr>(dynamic_cast<TokenExpr*>(bioprhs.getLeftPtr().release())),
    bioprhs.getRightPtr());
}